

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O1

int mask_contains(uint32_t *a,uint32_t *b,int size)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < size) {
    uVar2 = size + 0x1fU >> 5;
    uVar1 = 1;
    if (1 < uVar2) {
      uVar1 = (ulong)uVar2;
    }
    uVar3 = 0;
    do {
      if ((b[uVar3] & ~a[uVar3]) != 0) {
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return 1;
}

Assistant:

int mask_contains(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if ((a[i] & b[i]) != b[i]) {
			return 0;
		}
	return 1;
}